

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::SolverParameter::SharedDtor(SolverParameter *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->train_net_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->lr_policy_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->snapshot_prefix_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->net_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->regularization_type_,(string *)&_default_regularization_type__abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->type_,(string *)&_default_type__abi_cxx11_);
  if (this != (SolverParameter *)&_SolverParameter_default_instance_) {
    if (this->train_net_param_ != (NetParameter *)0x0) {
      (*(this->train_net_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
    if (this->net_param_ != (NetParameter *)0x0) {
      (*(this->net_param_->super_Message).super_MessageLite._vptr_MessageLite[1])();
    }
    if (this->train_state_ != (NetState *)0x0) {
      (*(this->train_state_->super_Message).super_MessageLite._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void SolverParameter::SharedDtor() {
  train_net_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  lr_policy_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  snapshot_prefix_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  net_.DestroyNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  regularization_type_.DestroyNoArena(&SolverParameter::_default_regularization_type_.get());
  type_.DestroyNoArena(&SolverParameter::_default_type_.get());
  if (this != internal_default_instance()) {
    delete train_net_param_;
  }
  if (this != internal_default_instance()) {
    delete net_param_;
  }
  if (this != internal_default_instance()) {
    delete train_state_;
  }
}